

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int aead_do_decrypt(ptls_aead_context_t *_ctx,void *_output,size_t *outlen,void *input,size_t inlen,
                   void *iv,uint8_t unused)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  int blocklen;
  
  blocklen = (int)((ulong)in_RAX >> 0x20);
  *outlen = 0;
  iVar2 = 0x14;
  if (_ctx[1].seq <= inlen) {
    iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                               (uchar *)0x0,(uchar *)iv);
    iVar2 = 0x203;
    if (iVar1 != 0) {
      iVar1 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)_output,&blocklen,
                                (uchar *)input,(int)inlen - (int)_ctx[1].seq);
      if (iVar1 != 0) {
        *outlen = *outlen + (long)blocklen;
        iVar1 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)_ctx[1].algo,0x11,(int)_ctx[1].seq,
                                    (void *)((long)input + (inlen - _ctx[1].seq)));
        if (iVar1 != 0) {
          iVar1 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)_ctx[1].algo,
                                      (uchar *)((long)_output + *outlen),&blocklen);
          iVar2 = 0x14;
          if (iVar1 != 0) {
            *outlen = *outlen + (long)blocklen;
            iVar2 = 0;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int aead_do_decrypt(ptls_aead_context_t *_ctx, void *_output, size_t *outlen, const void *input, size_t inlen,
                           const void *iv, uint8_t unused)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output;
    int blocklen;

    *outlen = 0;

    if (inlen < ctx->tag_size)
        return PTLS_ALERT_BAD_RECORD_MAC;

    if (!EVP_DecryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv))
        return PTLS_ERROR_LIBRARY;
    if (!EVP_DecryptUpdate(ctx->evp_ctx, output, &blocklen, input, (int)(inlen - ctx->tag_size)))
        return PTLS_ERROR_LIBRARY;
    *outlen += blocklen;
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_TAG, (int)ctx->tag_size,
                             (void *)((uint8_t *)input + inlen - ctx->tag_size)))
        return PTLS_ERROR_LIBRARY;
    if (!EVP_DecryptFinal_ex(ctx->evp_ctx, output + *outlen, &blocklen))
        return PTLS_ALERT_BAD_RECORD_MAC;
    *outlen += blocklen;

    return 0;
}